

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# msgio.c
# Opt level: O0

int buf_send(int sock,void *buf,size_t size)

{
  ssize_t sVar1;
  int *piVar2;
  void *local_30;
  uchar *ptr;
  ssize_t done;
  size_t size_local;
  void *buf_local;
  int sock_local;
  
  if (sock < 0) {
    __assert_fail("sock >= 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Zer0-One[P]libnv-portable/src/msgio.c"
                  ,0x1ae,"int buf_send(int, void *, size_t)");
  }
  if (size != 0) {
    local_30 = buf;
    done = size;
    if (buf == (void *)0x0) {
      __assert_fail("buf != ((void*)0)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Zer0-One[P]libnv-portable/src/msgio.c"
                    ,0x1b0,"int buf_send(int, void *, size_t)");
    }
    do {
      fd_wait(sock,false);
      sVar1 = send(sock,local_30,done,0);
      if (sVar1 == -1) {
        piVar2 = __errno_location();
        if (*piVar2 != 4) {
          return -1;
        }
      }
      else {
        if (sVar1 == 0) {
          piVar2 = __errno_location();
          *piVar2 = 0x6b;
          return -1;
        }
        done = done - sVar1;
        local_30 = (void *)(sVar1 + (long)local_30);
      }
    } while (done != 0);
    return 0;
  }
  __assert_fail("size > 0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Zer0-One[P]libnv-portable/src/msgio.c"
                ,0x1af,"int buf_send(int, void *, size_t)");
}

Assistant:

int
buf_send(int sock, void *buf, size_t size)
{
	ssize_t done;
	unsigned char *ptr;

	PJDLOG_ASSERT(sock >= 0);
	PJDLOG_ASSERT(size > 0);
	PJDLOG_ASSERT(buf != NULL);

	ptr = buf;
	do {
		fd_wait(sock, false);
		done = send(sock, ptr, size, 0);
		if (done == -1) {
			if (errno == EINTR)
				continue;
			return (-1);
		} else if (done == 0) {
			errno = ENOTCONN;
			return (-1);
		}
		size -= done;
		ptr += done;
	} while (size > 0);

	return (0);
}